

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Net::find_blob_index_by_name(Net *this,char *name)

{
  int iVar1;
  pointer pBVar2;
  long lVar3;
  ulong uVar4;
  
  pBVar2 = (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      iVar1 = std::__cxx11::string::compare
                        ((char *)((long)&(pBVar2->name)._M_dataplus._M_p + lVar3));
      if (iVar1 == 0) goto LAB_001a623b;
      uVar4 = uVar4 + 1;
      pBVar2 = (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x70;
    } while (uVar4 < (ulong)(((long)(this->d->blobs).
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 4) *
                            0x6db6db6db6db6db7));
  }
  find_blob_index_by_name();
  uVar4 = 0xffffffff;
LAB_001a623b:
  return (int)uVar4;
}

Assistant:

int Net::find_blob_index_by_name(const char* name) const
{
    for (size_t i = 0; i < d->blobs.size(); i++)
    {
        const Blob& blob = d->blobs[i];
        if (blob.name == name)
        {
            return static_cast<int>(i);
        }
    }

    NCNN_LOGE("find_blob_index_by_name %s failed", name);
    return -1;
}